

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinNE<0,_4,_1>::propagate(BinNE<0,_4,_1> *this)

{
  BoolView *this_00;
  IntView<0> *this_01;
  IntVar *pIVar1;
  IntVar *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Lit LVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar8;
  long v;
  
  this_00 = &this->r;
  bVar3 = BoolView::isFalse(this_00);
  if (!bVar3) {
    pIVar1 = (this->x).var;
    iVar4 = (pIVar1->min).v;
    if ((((iVar4 == (pIVar1->max).v) &&
         (pIVar2 = (this->y).var, iVar6 = (pIVar2->min).v, iVar6 == (pIVar2->max).v)) &&
        ((long)(this->y).b + (long)iVar6 == (long)iVar4)) &&
       ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v])) {
      if (so.lazy == true) {
        iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[10])();
        uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
        r._a = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      bVar3 = BoolView::setVal(this_00,false,(Reason)r);
      if (!bVar3) {
        return false;
      }
    }
    bVar3 = BoolView::isTrue(this_00);
    if (!bVar3) {
      return true;
    }
    this_01 = &this->x;
    iVar4 = (this_01->var->min).v;
    if ((iVar4 == (this_01->var->max).v) &&
       (bVar3 = IntView<4>::indomain(&this->y,(long)iVar4), bVar3)) {
      if (so.lazy == true) {
        iVar6 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[10])();
        LVar7 = BoolView::getValLit(this_00);
        uVar8 = (ulong)(uint)LVar7.x << 0x20 | (long)iVar6 << 2 | 3;
      }
      else {
        uVar8 = 0;
      }
      pIVar1 = (this->y).var;
      iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0x11])
                        (pIVar1,(long)iVar4 - (long)(this->y).b,uVar8,1);
      if ((char)iVar4 == '\0') {
        return false;
      }
    }
    pIVar1 = (this->y).var;
    iVar4 = (pIVar1->min).v;
    if (iVar4 == (pIVar1->max).v) {
      v = (long)(this->y).b + (long)iVar4;
      bVar3 = IntView<0>::indomain(this_01,v);
      if (bVar3) {
        if (so.lazy == true) {
          iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[10])();
          LVar7 = BoolView::getValLit(this_00);
          uVar8 = (ulong)(uint)LVar7.x << 0x20 | (long)iVar4 << 2 | 3;
        }
        else {
          uVar8 = 0;
        }
        iVar4 = (*(this_01->var->super_Var).super_Branching._vptr_Branching[0x11])
                          (this_01->var,v,uVar8,1);
        if ((char)iVar4 == '\0') {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		if (x.isFixed() && y.isFixed() && x.getVal() == y.getVal()) {
			setDom(r, setVal, 0, x.getValLit(), y.getValLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		if (x.isFixed()) {
			if (R != 0) {
				setDom(y, remVal, x.getVal(), x.getValLit(), r.getValLit());
			} else {
				setDom(y, remVal, x.getVal(), x.getValLit());
			}
		}
		if (y.isFixed()) {
			if (R != 0) {
				setDom(x, remVal, y.getVal(), y.getValLit(), r.getValLit());
			} else {
				setDom(x, remVal, y.getVal(), y.getValLit());
			}
		}

		return true;
	}